

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search_utils.h
# Opt level: O0

int model_intra_yrd_and_prune(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int64_t *best_model_rd)

{
  int64_t iVar1;
  long *in_RCX;
  int64_t this_model_rd;
  AV1_COMMON *cm;
  int plane;
  int in_stack_0000001c;
  TX_SIZE tx_size;
  undefined7 in_stack_00000028;
  int local_4;
  
  iVar1 = intra_model_rd((AV1_COMMON *)x,(MACROBLOCK *)CONCAT17(bsize,in_stack_00000028),
                         best_model_rd._4_4_,best_model_rd._3_1_,best_model_rd._2_1_,
                         in_stack_0000001c);
  if ((*in_RCX == 0x7fffffffffffffff) || (iVar1 <= *in_RCX + (*in_RCX >> 2))) {
    if (iVar1 < *in_RCX) {
      *in_RCX = iVar1;
    }
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static inline int model_intra_yrd_and_prune(const AV1_COMP *const cpi,
                                            MACROBLOCK *x, BLOCK_SIZE bsize,
                                            int64_t *best_model_rd) {
  const TX_SIZE tx_size = AOMMIN(TX_32X32, max_txsize_lookup[bsize]);
  const int plane = 0;
  const AV1_COMMON *cm = &cpi->common;
  const int64_t this_model_rd =
      intra_model_rd(cm, x, plane, bsize, tx_size, /*use_hadamard=*/1);
  if (*best_model_rd != INT64_MAX &&
      this_model_rd > *best_model_rd + (*best_model_rd >> 2)) {
    return 1;
  } else if (this_model_rd < *best_model_rd) {
    *best_model_rd = this_model_rd;
  }
  return 0;
}